

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

Uint32 __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::CountFunctionArguments
          (ConversionStream *this,iterator *Token,iterator *ScopeEnd)

{
  uint uVar1;
  bool bVar2;
  ConversionStream *this_00;
  bool bVar3;
  int iVar4;
  _List_node_base *p_Var5;
  char (*in_RCX) [36];
  TokenListType *Args_1;
  Uint32 UVar6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  int iVar9;
  int iVar10;
  string msg;
  String local_58;
  ConversionStream *local_38;
  
  p_Var5 = Token->_M_node;
  local_38 = this;
  if (*(int *)&p_Var5[1]._M_next == 0x135) {
    p_Var7 = ScopeEnd->_M_node;
LAB_001c32b9:
    p_Var5 = p_Var5->_M_next;
    Token->_M_node = p_Var5;
    iVar10 = 1;
    bVar2 = true;
  }
  else {
    FormatString<char[26],char[36]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == TokenType::OpenParen",in_RCX);
    in_RCX = (char (*) [36])0x68a;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CountFunctionArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x68a);
    std::__cxx11::string::~string((string *)&msg);
    p_Var5 = Token->_M_node;
    bVar2 = false;
    p_Var7 = ScopeEnd->_M_node;
    iVar10 = 0;
    if (*(int *)&p_Var5[1]._M_next == 0x135) goto LAB_001c32b9;
  }
  UVar6 = 0;
  iVar4 = iVar10;
  while (this_00 = local_38, p_Var8 = p_Var7, iVar9 = iVar4, p_Var5 != p_Var7) {
    uVar1 = *(uint *)&p_Var5[1]._M_next;
    in_RCX = (char (*) [36])(ulong)uVar1;
    if (uVar1 == 0x136) {
      iVar9 = iVar4 + -1;
      bVar3 = iVar4 <= iVar10;
      p_Var8 = p_Var5;
      iVar4 = iVar9;
      if (bVar3) break;
    }
    else if (uVar1 == 0x135) {
      iVar4 = iVar4 + 1;
    }
    UVar6 = UVar6 + (UVar6 == 0);
    if (iVar4 == 1) {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &p_Var5[1]._M_prev,",");
      UVar6 = UVar6 + bVar3;
      p_Var5 = Token->_M_node;
    }
    p_Var5 = p_Var5->_M_next;
    Token->_M_node = p_Var5;
  }
  if (bVar2) {
    if (p_Var8 == (_List_node_base *)&local_38->m_Tokens) {
      FormatString<char[38]>(&msg,(char (*) [38])"Unexpected EOF while processing scope");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_58,this_00,Token,4);
      in_RCX = (char (*) [36])0xd1e;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessScope",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xd1e,&msg,(char (*) [2])0x2c8293,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&msg);
      p_Var5 = Token->_M_node;
    }
    if (*(int *)&p_Var5[1]._M_next == 0x136) goto LAB_001c345d;
    FormatString<char[26],char[32]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == ClosingParenType",(char (*) [32])in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ProcessScope",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd1f);
  }
  else {
    if (iVar9 == 0) goto LAB_001c345d;
    FormatString<char[20]>(&msg,(char (*) [20])"Unbalanced brackets");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_58,this_00,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessScope",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd23,&msg,(char (*) [2])0x2c8293,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::~string((string *)&msg);
LAB_001c345d:
  Args_1 = &this_00->m_Tokens;
  p_Var5 = Token->_M_node;
  if (p_Var5 == (_List_node_base *)Args_1) {
    FormatString<char[46]>(&msg,(char (*) [46])"Unexpected EOF while processing argument list");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_58,this_00,Token,4);
    Args_1 = (TokenListType *)0x6a0;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"CountFunctionArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x6a0,&msg,(char (*) [2])0x2c8293,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&msg);
    p_Var5 = Token->_M_node;
  }
  if (*(int *)&p_Var5[1]._M_next != 0x136) {
    FormatString<char[26],char[39]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == TokenType::ClosingParen",(char (*) [39])Args_1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CountFunctionArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x6a1);
    std::__cxx11::string::~string((string *)&msg);
    p_Var5 = Token->_M_node;
  }
  Token->_M_node = p_Var5->_M_next;
  return UVar6;
}

Assistant:

Uint32 HLSL2GLSLConverterImpl::ConversionStream::CountFunctionArguments(TokenListType::iterator& Token, const TokenListType::iterator& ScopeEnd)
{
    // TestText.Sample( TestText_sampler, float2(0.0, 1.0)  );
    //                ^
    VERIFY_EXPR(Token->Type == TokenType::OpenParen);
    Uint32 NumArguments = 0;
    ProcessScope(
        Token, ScopeEnd, TokenType::OpenParen, TokenType::ClosingParen,
        [&](TokenListType::iterator& tkn, int ScopeDepth) {
            // Argument list is not empty, so there is at least one argument.
            if (NumArguments == 0)
                NumArguments = 1;
            // Number of additional arguments equals the number of commas
            // in scope depth 1

            // Do not count arguments of nested functions:
            // TestText.Sample( TestText_sampler, float2(0.0, 1.0)  );
            //                                          ^
            //                                        ScopeDepth == 2
            if (ScopeDepth == 1 && tkn->Literal == ",")
                ++NumArguments;
            ++tkn;
        } //
    );
    // TestText.Sample( TestText_sampler, float2(0.0, 1.0)  );
    //                                                      ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF while processing argument list");
    VERIFY_EXPR(Token->Type == TokenType::ClosingParen);
    ++Token;
    // TestText.Sample( TestText_sampler, float2(0.0, 1.0)  );
    //                                                       ^
    return NumArguments;
}